

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_tuple_primitive_byteNew
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_object_tuple_t *psVar1;
  size_t byteSize;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  byteSize = *arguments >> 4;
  if ((*arguments & 0xf) == 0) {
    byteSize = 0;
  }
  psVar1 = sysbvm_context_allocateByteTuple(context,0,byteSize);
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_byteNew(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    return (sysbvm_tuple_t)sysbvm_context_allocateByteTuple(context, SYSBVM_NULL_TUPLE, sysbvm_tuple_anySize_decode(arguments[0]));
}